

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

UtxoObjectStruct * __thiscall
cfd::js::api::json::UtxoObject::ConvertToStruct
          (UtxoObjectStruct *__return_storage_ptr__,UtxoObject *this)

{
  UtxoObjectStruct::UtxoObjectStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->vout = this->vout_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->address);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->locking_script);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->descriptor);
  __return_storage_ptr__->amount = this->amount_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->confidential_value_commitment);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->asset);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->confidential_asset_commitment);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->blind_factor);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->asset_blind_factor);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->script_sig_template);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

UtxoObjectStruct UtxoObject::ConvertToStruct() const {  // NOLINT
  UtxoObjectStruct result;
  result.txid = txid_;
  result.vout = vout_;
  result.address = address_;
  result.locking_script = locking_script_;
  result.descriptor = descriptor_;
  result.amount = amount_;
  result.confidential_value_commitment = confidential_value_commitment_;
  result.asset = asset_;
  result.confidential_asset_commitment = confidential_asset_commitment_;
  result.blind_factor = blind_factor_;
  result.asset_blind_factor = asset_blind_factor_;
  result.script_sig_template = script_sig_template_;
  result.ignore_items = ignore_items;
  return result;
}